

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::ParseString::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,char *msg,FileLoc *loc)

{
  char **in_stack_00000020;
  char *in_stack_00000028;
  FileLoc *in_stack_00000030;
  
  ErrorExit<char_const*&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
}

Assistant:

void ParseString(SceneRepresentation *scene, std::string str) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };
    std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromString(std::move(str), tokError);
    if (!t)
        return;
    parse(scene, std::move(t));
}